

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O2

void history_unmask_unknown(player *p)

{
  long lVar1;
  _Bool _Var2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  
  sVar3 = (p->hist).next;
  lVar1 = sVar3 * 0x5c;
  while( true ) {
    lVar4 = lVar1;
    bVar5 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar5) break;
    _Var2 = flag_has_dbg((p->hist).entries[-1].type + lVar4,2,2,"h->entries[i].type",
                         "HIST_ARTIFACT_UNKNOWN");
    lVar1 = lVar4 + -0x5c;
    if (_Var2) {
      flag_off((p->hist).entries[-1].type + lVar4,2,2);
      flag_on_dbg((p->hist).entries[-1].type + lVar4,2,3,"h->entries[i].type","HIST_ARTIFACT_KNOWN")
      ;
    }
  }
  return;
}

Assistant:

void history_unmask_unknown(struct player *p)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_UNKNOWN)) {
			hist_off(h->entries[i].type, HIST_ARTIFACT_UNKNOWN);
			hist_on(h->entries[i].type, HIST_ARTIFACT_KNOWN);
		}
	}
}